

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gauss.h
# Opt level: O2

void __thiscall gimage::GaussKernel::set(GaussKernel *this,float s)

{
  float *pfVar1;
  ulong uVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  int i;
  long lVar6;
  uint uVar7;
  float fVar8;
  float fVar9;
  
  if (s <= 0.5) {
    s = 0.5;
  }
  uVar4 = (uint)(s * 5.0 + 0.5);
  uVar7 = uVar4 | 1;
  this->kn = uVar7;
  uVar5 = 0xffffffffffffffff;
  if (-1 < (int)uVar4) {
    uVar5 = (long)(int)uVar7 << 2;
  }
  pfVar1 = (float *)operator_new__(uVar5);
  this->kernel = pfVar1;
  this->kn2 = (int)uVar4 >> 1;
  fVar9 = 0.0;
  for (lVar6 = 0; lVar6 < (int)uVar7; lVar6 = lVar6 + 1) {
    iVar3 = (int)lVar6 - this->kn2;
    fVar8 = expf((float)-(iVar3 * iVar3) / ((s + s) * s));
    pfVar1[lVar6] = fVar8;
    fVar9 = fVar9 + fVar8;
    uVar7 = this->kn;
  }
  uVar2 = 0;
  uVar5 = (ulong)uVar7;
  if ((int)uVar7 < 1) {
    uVar5 = uVar2;
  }
  for (; uVar5 != uVar2; uVar2 = uVar2 + 1) {
    pfVar1[uVar2] = pfVar1[uVar2] / fVar9;
  }
  return;
}

Assistant:

void set(float s)
    {
      s=std::max(0.5f, s);

      kn=static_cast<int>(5*s+0.5f);

      if ((kn&1) == 0)
      {
        kn++;
      }

      kernel=new float [kn];

      kn2=kn>>1;

      float sum=0;
      for (int i=0; i<kn; i++)
      {
        kernel[i]=static_cast<float>(std::exp(-(i-kn2)*(i-kn2)/(2*s*s)));
        sum+=kernel[i];
      }

      for (int i=0; i<kn; i++)
      {
        kernel[i]/=sum;
      }
    }